

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::RandomBufferWriteCase::init(RandomBufferWriteCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  int extraout_EAX;
  BufferVerifier *this_00;
  
  deqp::gls::BufferTestUtil::BufferCase::init(&this->super_BufferCase,ctx);
  this->m_iterNdx = 0;
  dVar1 = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this->m_buffer = dVar1;
  this->m_curSize = 0;
  this_00 = (BufferVerifier *)operator_new(8);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (this_00,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             VERIFY_AS_VERTEX_ARRAY);
  this->m_verifier = this_00;
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		BufferCase::init();

		m_iterNdx	= 0;
		m_buffer	= genBuffer();
		m_curSize	= 0;
		m_verifier	= new BufferVerifier(m_renderCtx, m_testCtx.getLog(), VERIFY_AS_VERTEX_ARRAY);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}